

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeHandler.cpp
# Opt level: O1

int Js::DynamicTypeHandler::RoundUpSlotCapacity(int slotCapacity,PropertyIndex inlineSlotCapacity)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  uint uVar5;
  
  if (slotCapacity < 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                ,0x2f,"(slotCapacity >= 0)","slotCapacity >= 0");
    if (!bVar2) goto LAB_00e5f6b1;
    *puVar4 = 0;
  }
  uVar3 = (uint)inlineSlotCapacity;
  if ((int)(uint)inlineSlotCapacity < slotCapacity) {
    uVar3 = (slotCapacity - (uint)inlineSlotCapacity) + 3 & 0xfffffffc;
    uVar5 = inlineSlotCapacity + uVar3;
    if ((int)uVar5 < (int)uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/TypeHandler.cpp"
                                  ,0x37,"(auxSlotCapacity + inlineSlotCapacity >= auxSlotCapacity)",
                                  "auxSlotCapacity + inlineSlotCapacity >= auxSlotCapacity");
      if (!bVar2) {
LAB_00e5f6b1:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    uVar3 = 0xfffe;
    if (0xfffe < slotCapacity) {
      uVar3 = 0x3fffffff;
    }
    if ((int)uVar5 <= (int)uVar3) {
      uVar3 = uVar5;
    }
  }
  return uVar3;
}

Assistant:

int DynamicTypeHandler::RoundUpSlotCapacity(const int slotCapacity, const PropertyIndex inlineSlotCapacity)
    {
        Assert(slotCapacity >= 0);

        if(slotCapacity <= inlineSlotCapacity)
        {
            return inlineSlotCapacity;
        }

        const int auxSlotCapacity = RoundUpAuxSlotCapacity(slotCapacity - inlineSlotCapacity);
        Assert(auxSlotCapacity + inlineSlotCapacity >= auxSlotCapacity);
        const int maxSlotCapacity =
            slotCapacity <= PropertyIndexRanges<PropertyIndex>::MaxValue
                ? PropertyIndexRanges<PropertyIndex>::MaxValue
                : PropertyIndexRanges<BigPropertyIndex>::MaxValue;
        return min(maxSlotCapacity, inlineSlotCapacity + auxSlotCapacity);
    }